

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdataurl.cpp
# Opt level: O3

bool qDecodeDataUrl(QUrl *uri,QString *mimeType,QByteArray *payload)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QByteArrayView view;
  bool bVar4;
  CutResult CVar5;
  void *pvVar6;
  char *pcVar7;
  storage_type *size;
  long lVar8;
  char *b;
  long in_FS_OFFSET;
  bool bVar9;
  QLatin1StringView rhs;
  QLatin1StringView needle;
  QLatin1StringView needle_00;
  QByteArrayView QVar10;
  QStringView lhs;
  QLatin1StringView haystack;
  storage_type *psVar11;
  QStringBuilder<QLatin1String_&,_QLatin1String> local_90;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QUrl::scheme(&local_58,uri);
  bVar9 = true;
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x4) {
    rhs.m_data = "data";
    rhs.m_size = 4;
    lhs.m_data = local_58.d.ptr;
    lhs.m_size = 4;
    bVar4 = QtPrivate::equalStrings(lhs,rhs);
    if (bVar4) {
      QUrl::host(&local_78,uri,(ComponentFormattingOptions)0x7f00000);
      bVar9 = local_78.d.size != 0;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar9 == false) {
    pQVar1 = &((mimeType->d).d)->super_QArrayData;
    (mimeType->d).d = (Data *)0x0;
    (mimeType->d).ptr = L"text/plain;charset=US-ASCII";
    (mimeType->d).size = 0x1b;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::url((QString *)&local_90,uri,(FormattingOptions)0x1f00001);
    QString::toLatin1_helper_inplace((QByteArray *)&local_78,(QString *)&local_90);
    QByteArray::fromPercentEncoding((QByteArray *)&local_58,(QByteArray *)&local_78,'%');
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
    if ((QArrayData *)local_90.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_90.a)->m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_90.a)->m_size)->_q_value).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_90.a)->m_size)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate((QArrayData *)local_90.a,2,0x10);
      }
    }
    qVar3 = local_58.d.size;
    pcVar2 = local_58.d.ptr;
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      pvVar6 = memchr(local_58.d.ptr,0x2c,local_58.d.size);
      lVar8 = (long)pvVar6 - (long)pcVar2;
      if (lVar8 != -1 && pvVar6 != (void *)0x0) {
        local_90.a = (QLatin1String *)(lVar8 + 1);
        psVar11 = (storage_type *)0xffffffffffffffff;
        CVar5 = QtPrivate::QContainerImplHelper::mid
                          (qVar3,(qsizetype *)&local_90,(qsizetype *)&stack0xffffffffffffff58);
        if (CVar5 == Null) {
          size = (storage_type *)0x0;
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = (char *)((long)&(((QBasicAtomicInt *)&(local_90.a)->m_size)->_q_value).
                                   super___atomic_base<int>._M_i + (long)pcVar2);
          size = psVar11;
        }
        QByteArray::QByteArray((QByteArray *)&local_78,pcVar7,(qsizetype)size);
        pQVar1 = &((payload->d).d)->super_QArrayData;
        pcVar2 = (char16_t *)(payload->d).ptr;
        (payload->d).d = (Data *)local_78.d.d;
        (payload->d).ptr = (char *)local_78.d.ptr;
        qVar3 = (payload->d).size;
        (payload->d).size = local_78.d.size;
        local_78.d.d = (Data *)pQVar1;
        local_78.d.ptr = pcVar2;
        local_78.d.size = qVar3;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,1,0x10);
          }
        }
        QVar10.m_data = psVar11;
        QVar10.m_size = 0x221b6e;
        QVar10 = QtPrivate::trimmed(QVar10);
        lVar8 = QVar10.m_size;
        needle.m_data = ";base64";
        needle.m_size = 7;
        bVar4 = QtPrivate::endsWith((QLatin1StringView)QVar10,needle,CaseInsensitive);
        if (bVar4) {
          QByteArray::fromBase64((QByteArray *)&local_78,payload,(Base64Options)0x0);
          pQVar1 = &((payload->d).d)->super_QArrayData;
          pcVar2 = (char16_t *)(payload->d).ptr;
          (payload->d).d = (Data *)local_78.d.d;
          (payload->d).ptr = (char *)local_78.d.ptr;
          qVar3 = (payload->d).size;
          (payload->d).size = local_78.d.size;
          local_78.d.d = (Data *)pQVar1;
          local_78.d.ptr = pcVar2;
          local_78.d.size = qVar3;
          if (pQVar1 != (QArrayData *)0x0) {
            LOCK();
            (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar1,1,0x10);
            }
          }
          lVar8 = lVar8 + -7;
        }
        psVar11 = (storage_type *)0x0;
        needle_00.m_data = "charset";
        needle_00.m_size = 7;
        haystack.m_data = QVar10.m_data;
        haystack.m_size = lVar8;
        bVar4 = QtPrivate::startsWith(haystack,needle_00,CaseInsensitive);
        if (bVar4) {
          for (pcVar7 = QVar10.m_data + 7; *pcVar7 == ' '; pcVar7 = pcVar7 + 1) {
          }
          if (*pcVar7 == '=') {
            psVar11 = (storage_type *)0xb;
          }
        }
        if (lVar8 != 0) {
          view.m_data = psVar11;
          view.m_size = 0x221c51;
          local_90.b = (QLatin1String)QtPrivate::trimmed(view);
          local_90.a = (QLatin1String *)&stack0xffffffffffffff58;
          QStringBuilder<QLatin1String_&,_QLatin1String>::convertTo<QString>(&local_78,&local_90);
          pQVar1 = &((mimeType->d).d)->super_QArrayData;
          pcVar2 = (mimeType->d).ptr;
          (mimeType->d).d = local_78.d.d;
          (mimeType->d).ptr = local_78.d.ptr;
          qVar3 = (mimeType->d).size;
          (mimeType->d).size = local_78.d.size;
          local_78.d.d = (Data *)pQVar1;
          local_78.d.ptr = pcVar2;
          local_78.d.size = qVar3;
          if (pQVar1 != (QArrayData *)0x0) {
            LOCK();
            (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar1,2,0x10);
            }
          }
        }
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar9 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT bool qDecodeDataUrl(const QUrl &uri, QString &mimeType, QByteArray &payload)
{
    if (uri.scheme() != "data"_L1 || !uri.host().isEmpty())
        return false;

    mimeType = QStringLiteral("text/plain;charset=US-ASCII");

    // the following would have been the correct thing, but
    // reality often differs from the specification. People have
    // data: URIs with ? and #
    //QByteArray data = QByteArray::fromPercentEncoding(uri.path(QUrl::FullyEncoded).toLatin1());
    const QByteArray dataArray =
            QByteArray::fromPercentEncoding(uri.url(QUrl::FullyEncoded | QUrl::RemoveScheme).toLatin1());
    QByteArrayView data = dataArray;

    // parse it:
    const qsizetype pos = data.indexOf(',');
    if (pos != -1) {
        payload = data.mid(pos + 1).toByteArray();
        data.truncate(pos);
        data = data.trimmed();

        // find out if the payload is encoded in Base64
        constexpr auto base64 = ";base64"_L1;
        if (QLatin1StringView{data}.endsWith(base64, Qt::CaseInsensitive)) {
            payload = QByteArray::fromBase64(payload);
            data.chop(base64.size());
        }

        QLatin1StringView textPlain;
        constexpr auto charset = "charset"_L1;
        if (QLatin1StringView{data}.startsWith(charset, Qt::CaseInsensitive)) {
            qsizetype i = charset.size();
            while (data.at(i) == ' ')
                ++i;
            if (data.at(i) == '=')
                textPlain = "text/plain;"_L1;
        }

        if (!data.isEmpty())
            mimeType = textPlain + QLatin1StringView(data.trimmed());
    }

    return true;
}